

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O2

void __thiscall
ThreadedReplayer::enqueue_deferred_pipelines<ThreadedReplayer::DeferredRayTracingInfo>
          (ThreadedReplayer *this,
          vector<ThreadedReplayer::DeferredRayTracingInfo,_std::allocator<ThreadedReplayer::DeferredRayTracingInfo>_>
          *deferred,
          unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
          *pipelines,
          unordered_map<unsigned_long,_ThreadedReplayer::DeferredRayTracingInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredRayTracingInfo>_>_>
          *parents,vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> *work,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *hashes,uint start_index)

{
  vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> *this_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint local_ec;
  undefined1 local_e0 [8];
  undefined1 local_d8 [8];
  undefined1 local_d0 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  __shared_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  local_b8;
  undefined1 local_a8 [8];
  undefined1 local_a0 [16];
  undefined8 local_90;
  uint local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  ThreadedReplayer *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  uint local_68;
  int local_64;
  vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> *local_60;
  shared_ptr<std::vector<ThreadedReplayer::DeferredRayTracingInfo,_std::allocator<ThreadedReplayer::DeferredRayTracingInfo>_>_>
  derived;
  shared_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
  parsed_parents;
  
  local_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)parents;
  local_78 = (ThreadedReplayer *)pipelines;
  local_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)deferred;
  local_60 = work;
  std::
  make_shared<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>>
            ();
  iVar1 = 0;
  local_ec = 0;
  uVar2 = 0;
  uVar5 = 0;
  while( true ) {
    uVar4 = (long)(hashes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(hashes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    if (uVar4 <= uVar5) break;
    uVar3 = (int)uVar4 + iVar1;
    if (0x3ff < uVar3) {
      uVar3 = 0x400;
    }
    local_64 = iVar1;
    std::
    make_shared<std::vector<ThreadedReplayer::DeferredRayTracingInfo,std::allocator<ThreadedReplayer::DeferredRayTracingInfo>>>
              ();
    iVar1 = (local_ec >> 1) * 0xe;
    local_e0._0_4_ = iVar1 + uVar2;
    local_a0._8_8_ = local_70;
    local_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uVar3,uVar2);
    local_a8 = (undefined1  [8])this;
    local_a0._0_8_ = hashes;
    local_88 = (uint)uVar5;
    std::function<void()>::
    function<ThreadedReplayer::enqueue_deferred_pipelines<ThreadedReplayer::DeferredRayTracingInfo>(std::vector<ThreadedReplayer::DeferredRayTracingInfo,std::allocator<ThreadedReplayer::DeferredRayTracingInfo>>*,std::unordered_map<unsigned_long,VkPipeline_T*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VkPipeline_T*>>>const&,std::unordered_map<unsigned_long,ThreadedReplayer::DeferredRayTracingInfo,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ThreadedReplayer::DeferredRayTracingInfo>>>&,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_int)::_lambda()_1_,void>
              ((function<void()> *)local_d8,(anon_class_40_6_ee6c0a18 *)local_a8);
    this_00 = local_60;
    std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::emplace_back<EnqueuedWork>
              (local_60,(EnqueuedWork *)local_e0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(code *)local_d0._8_8_)((function<void()> *)local_d8,(function<void()> *)local_d8,3);
    }
    if (uVar2 == 0) {
      local_e0._0_4_ = iVar1 + 2;
      local_d0._0_8_ = local_80;
      local_c0._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_replay.cpp:2745:22)>
           ::_M_invoke;
      local_d0._8_8_ =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_replay.cpp:2745:22)>
           ::_M_manager;
      local_d8 = (undefined1  [8])this;
      std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::emplace_back<EnqueuedWork>
                (this_00,(EnqueuedWork *)local_e0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (*(code *)local_d0._8_8_)(local_d8,local_d8,3);
      }
    }
    local_e0._0_4_ = iVar1 + uVar2 + 4;
    local_a8 = (undefined1  [8])this;
    local_68 = (uint)uVar5;
    std::
    __shared_ptr<std::vector<ThreadedReplayer::DeferredRayTracingInfo,_std::allocator<ThreadedReplayer::DeferredRayTracingInfo>_>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr((__shared_ptr<std::vector<ThreadedReplayer::DeferredRayTracingInfo,_std::allocator<ThreadedReplayer::DeferredRayTracingInfo>_>,_(__gnu_cxx::_Lock_policy)2>
                    *)local_a0,
                   &derived.
                    super___shared_ptr<std::vector<ThreadedReplayer::DeferredRayTracingInfo,_std::allocator<ThreadedReplayer::DeferredRayTracingInfo>_>,_(__gnu_cxx::_Lock_policy)2>
                  );
    local_90 = local_70;
    local_88 = uVar2;
    std::function<void()>::
    function<ThreadedReplayer::enqueue_deferred_pipelines<ThreadedReplayer::DeferredRayTracingInfo>(std::vector<ThreadedReplayer::DeferredRayTracingInfo,std::allocator<ThreadedReplayer::DeferredRayTracingInfo>>*,std::unordered_map<unsigned_long,VkPipeline_T*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VkPipeline_T*>>>const&,std::unordered_map<unsigned_long,ThreadedReplayer::DeferredRayTracingInfo,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ThreadedReplayer::DeferredRayTracingInfo>>>&,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_int)::_lambda()_3_,void>
              ((function<void()> *)local_d8,(anon_class_40_4_a1b55aa8 *)local_a8);
    std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::emplace_back<EnqueuedWork>
              (this_00,(EnqueuedWork *)local_e0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(code *)local_d0._8_8_)((function<void()> *)local_d8,(function<void()> *)local_d8,3);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
    local_a8._0_4_ = iVar1 + uVar2 + 6;
    local_e0 = (undefined1  [8])this;
    std::
    __shared_ptr<std::vector<ThreadedReplayer::DeferredRayTracingInfo,_std::allocator<ThreadedReplayer::DeferredRayTracingInfo>_>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr((__shared_ptr<std::vector<ThreadedReplayer::DeferredRayTracingInfo,_std::allocator<ThreadedReplayer::DeferredRayTracingInfo>_>,_(__gnu_cxx::_Lock_policy)2>
                    *)local_d8,
                   &derived.
                    super___shared_ptr<std::vector<ThreadedReplayer::DeferredRayTracingInfo,_std::allocator<ThreadedReplayer::DeferredRayTracingInfo>_>,_(__gnu_cxx::_Lock_policy)2>
                  );
    uVar3 = local_68;
    local_d0._8_8_ = local_70;
    local_c0._M_pi._4_4_ = local_68;
    local_c0._M_pi._0_4_ = uVar2;
    local_b8._M_ptr._0_4_ = start_index;
    std::function<void()>::
    function<ThreadedReplayer::enqueue_deferred_pipelines<ThreadedReplayer::DeferredRayTracingInfo>(std::vector<ThreadedReplayer::DeferredRayTracingInfo,std::allocator<ThreadedReplayer::DeferredRayTracingInfo>>*,std::unordered_map<unsigned_long,VkPipeline_T*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VkPipeline_T*>>>const&,std::unordered_map<unsigned_long,ThreadedReplayer::DeferredRayTracingInfo,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ThreadedReplayer::DeferredRayTracingInfo>>>&,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_int)::_lambda()_4_,void>
              ((function<void()> *)local_a0,(anon_class_48_6_076d015d *)local_e0);
    std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::emplace_back<EnqueuedWork>
              (this_00,(EnqueuedWork *)local_a8);
    if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(code *)local_90)((function<void()> *)local_a0,(function<void()> *)local_a0,3);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_d0);
    local_a8._0_4_ = iVar1 + uVar2 + 8;
    local_d8 = (undefined1  [8])local_78;
    local_d0._0_8_ = local_80;
    local_e0 = (undefined1  [8])this;
    std::
    __shared_ptr<std::vector<ThreadedReplayer::DeferredRayTracingInfo,_std::allocator<ThreadedReplayer::DeferredRayTracingInfo>_>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr((__shared_ptr<std::vector<ThreadedReplayer::DeferredRayTracingInfo,_std::allocator<ThreadedReplayer::DeferredRayTracingInfo>_>,_(__gnu_cxx::_Lock_policy)2>
                    *)(local_d0 + 8),
                   &derived.
                    super___shared_ptr<std::vector<ThreadedReplayer::DeferredRayTracingInfo,_std::allocator<ThreadedReplayer::DeferredRayTracingInfo>_>,_(__gnu_cxx::_Lock_policy)2>
                  );
    std::
    __shared_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_b8,
                   &parsed_parents.
                    super___shared_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                  );
    std::function<void()>::
    function<ThreadedReplayer::enqueue_deferred_pipelines<ThreadedReplayer::DeferredRayTracingInfo>(std::vector<ThreadedReplayer::DeferredRayTracingInfo,std::allocator<ThreadedReplayer::DeferredRayTracingInfo>>*,std::unordered_map<unsigned_long,VkPipeline_T*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VkPipeline_T*>>>const&,std::unordered_map<unsigned_long,ThreadedReplayer::DeferredRayTracingInfo,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ThreadedReplayer::DeferredRayTracingInfo>>>&,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_int)::_lambda()_5_,void>
              ((function<void()> *)local_a0,(anon_class_56_5_71294dfa *)local_e0);
    std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::emplace_back<EnqueuedWork>
              (this_00,(EnqueuedWork *)local_a8);
    if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(code *)local_90)((function<void()> *)local_a0,(function<void()> *)local_a0,3);
    }
    enqueue_deferred_pipelines<ThreadedReplayer::DeferredRayTracingInfo>(std::vector<ThreadedReplayer::DeferredRayTracingInfo,std::allocator<ThreadedReplayer::DeferredRayTracingInfo>>*,std::unordered_map<unsigned_long,VkPipeline_T*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VkPipeline_T*>>>const&,std::unordered_map<unsigned_long,ThreadedReplayer::DeferredRayTracingInfo,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ThreadedReplayer::DeferredRayTracingInfo>>>&,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_int)
    ::{lambda()#5}::~unordered_map((_lambda___5_ *)local_e0);
    if (uVar2 == 0) {
      local_a8._0_4_ = iVar1 + 10;
      local_d8 = (undefined1  [8])local_78;
      local_d0._0_8_ = local_80;
      local_e0 = (undefined1  [8])this;
      std::
      __shared_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr((__shared_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                      *)(local_d0 + 8),
                     &parsed_parents.
                      super___shared_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                    );
      local_b8._M_ptr._0_4_ = uVar3;
      local_b8._M_ptr._4_4_ = start_index;
      std::function<void()>::
      function<ThreadedReplayer::enqueue_deferred_pipelines<ThreadedReplayer::DeferredRayTracingInfo>(std::vector<ThreadedReplayer::DeferredRayTracingInfo,std::allocator<ThreadedReplayer::DeferredRayTracingInfo>>*,std::unordered_map<unsigned_long,VkPipeline_T*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VkPipeline_T*>>>const&,std::unordered_map<unsigned_long,ThreadedReplayer::DeferredRayTracingInfo,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ThreadedReplayer::DeferredRayTracingInfo>>>&,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_int)::_lambda()_6_,void>
                ((function<void()> *)local_a0,(anon_class_48_6_745bc604 *)local_e0);
      std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::emplace_back<EnqueuedWork>
                (this_00,(EnqueuedWork *)local_a8);
      if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (*(code *)local_90)(local_a0,local_a0,3);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
    }
    local_a8._0_4_ = iVar1 + uVar2 + 0xc;
    local_d8 = (undefined1  [8])local_78;
    local_e0 = (undefined1  [8])this;
    std::
    __shared_ptr<std::vector<ThreadedReplayer::DeferredRayTracingInfo,_std::allocator<ThreadedReplayer::DeferredRayTracingInfo>_>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr((__shared_ptr<std::vector<ThreadedReplayer::DeferredRayTracingInfo,_std::allocator<ThreadedReplayer::DeferredRayTracingInfo>_>,_(__gnu_cxx::_Lock_policy)2>
                    *)local_d0,
                   &derived.
                    super___shared_ptr<std::vector<ThreadedReplayer::DeferredRayTracingInfo,_std::allocator<ThreadedReplayer::DeferredRayTracingInfo>_>,_(__gnu_cxx::_Lock_policy)2>
                  );
    local_c0._M_pi = local_80;
    local_b8._M_ptr._4_4_ = uVar3;
    local_b8._M_refcount._M_pi._0_4_ = start_index;
    local_b8._M_ptr._0_4_ = uVar2;
    std::function<void()>::
    function<ThreadedReplayer::enqueue_deferred_pipelines<ThreadedReplayer::DeferredRayTracingInfo>(std::vector<ThreadedReplayer::DeferredRayTracingInfo,std::allocator<ThreadedReplayer::DeferredRayTracingInfo>>*,std::unordered_map<unsigned_long,VkPipeline_T*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VkPipeline_T*>>>const&,std::unordered_map<unsigned_long,ThreadedReplayer::DeferredRayTracingInfo,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ThreadedReplayer::DeferredRayTracingInfo>>>&,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_int)::_lambda()_7_,void>
              ((function<void()> *)local_a0,(anon_class_56_7_ca1bbb61 *)local_e0);
    std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::emplace_back<EnqueuedWork>
              (this_00,(EnqueuedWork *)local_a8);
    if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(code *)local_90)((function<void()> *)local_a0,(function<void()> *)local_a0,3);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d0 + 8));
    uVar2 = ~uVar2 & 1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&derived.
                super___shared_ptr<std::vector<ThreadedReplayer::DeferredRayTracingInfo,_std::allocator<ThreadedReplayer::DeferredRayTracingInfo>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    uVar5 = (ulong)(uVar3 + 0x400);
    local_ec = local_ec + 1;
    iVar1 = local_64 + -0x400;
  }
  local_e0._0_4_ = (local_ec >> 1) * 0xe + uVar2;
  local_d0._4_4_ = 0;
  local_d0._0_4_ = uVar2;
  local_c0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_replay.cpp:3003:20)>
       ::_M_invoke;
  local_d0._8_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_replay.cpp:3003:20)>
       ::_M_manager;
  local_d8 = (undefined1  [8])this;
  std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::emplace_back<EnqueuedWork>
            (local_60,(EnqueuedWork *)local_e0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(code *)local_d0._8_8_)(local_d8,local_d8,3);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parsed_parents.
              super___shared_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void enqueue_deferred_pipelines(vector<DerivedInfo> *deferred, const unordered_map<Hash, VkPipeline> &pipelines,
	                                unordered_map<Hash, DerivedInfo> &parents,
	                                vector<EnqueuedWork> &work, const vector<Hash> &hashes, unsigned start_index)
	{
		static const unsigned NUM_PIPELINES_PER_CONTEXT = 1024;

		// Make sure that if we sort by work_index, we get an interleaved execution pattern which
		// will naturally pipeline.
		enum PassOrder
		{
			PARSE_ENQUEUE_OFFSET = 0,
			MAINTAIN_LRU_CACHE = 1,
			ENQUEUE_SHADER_MODULES_PRIMARY_OFFSET = 2,
			RESOLVE_SHADER_MODULE_AND_ENQUEUE_PIPELINES_PRIMARY_OFFSET = 3,
			ENQUEUE_OUT_OF_RANGE_PARENT_PIPELINES = 4,
			ENQUEUE_SHADER_MODULE_SECONDARY_OFFSET = 5,
			ENQUEUE_DERIVED_PIPELINES_OFFSET = 6,
			PASS_COUNT = 7
		};

		unsigned memory_index = 0;
		unsigned iteration = 0;

		// This makes sure that we interleave execution of N iterations. Essentially, we get an execution order:
		// - Pass 0, chunk 0 (context 0)
		// - Pass 0, chunk 1 (context 1)
		// - Pass 1, chunk 0 (context 0)
		// - Pass 1, chunk 1 (context 1)
		// - ...
		// - Pass 6, chunk 0 (reclaim memory for context 0)
		// - Pass 6, chunk 1 (reclaim memory for context 1)
		// - Pass 7, sync point
		// - Pass 0, chunk 2 (context 0)
		// - Pass 1, chunk 3 (context 1)

		const auto get_order_index = [&](unsigned pass) -> unsigned {
			return (iteration / NUM_PIPELINE_MEMORY_CONTEXTS) * PASS_COUNT * NUM_PIPELINE_MEMORY_CONTEXTS +
			       pass * NUM_PIPELINE_MEMORY_CONTEXTS +
			       memory_index;
		};

		auto parsed_parents = make_shared<unordered_set<Hash>>();

		for (unsigned hash_offset = 0; hash_offset < hashes.size(); hash_offset += NUM_PIPELINES_PER_CONTEXT, iteration++)
		{
			unsigned left_to_submit = hashes.size() - hash_offset;
			unsigned to_submit = left_to_submit < NUM_PIPELINES_PER_CONTEXT ? left_to_submit : NUM_PIPELINES_PER_CONTEXT;

			// State which is used between pipeline stages.
			auto derived = make_shared<vector<DerivedInfo>>();

			// Submit pipelines to be parsed.
			work.push_back({ get_order_index(PARSE_ENQUEUE_OFFSET),
			                 [this, &hashes, deferred, memory_index, to_submit, hash_offset]() {
				                 // Drain old allocators.
				                 sync_worker_memory_context(memory_index);
				                 // Reset per memory-context allocators.
				                 for (auto &data : per_thread_data)
				                 {
					                 if (data.per_thread_replayers)
					                 {
						                 data.per_thread_replayers[memory_index].get_allocator().reset();
						                 // We might have to replay the same pipeline multiple times,
						                 // forget handle references.
						                 data.per_thread_replayers[memory_index].forget_pipeline_handle_references();
					                 }
				                 }

				                 // Important that memory is cleared here since we yoinked away the memory
				                 // when resetting allocators.
				                 deferred[memory_index].clear();

				                 deferred[memory_index].resize(to_submit);

				                 for (unsigned index = hash_offset; index < hash_offset + to_submit; index++)
				                 {
					                 auto tag = DerivedInfo::get_tag();
					                 if (cached_blobs[tag].count(hashes[index]) != 0)
					                 {
						                 // Do not do anything with this pipeline.
						                 // Need to check here which is not optimal, since we need to maintain a stable pipeline index
						                 // for the robust replayer mechanism.
						                 // TODO: Consider pre-parsing various databases and emit a SHM block for child replayer processes.
						                 if (opts.control_block)
						                 {
							                 if (tag == RESOURCE_GRAPHICS_PIPELINE)
							                 {
								                 opts.control_block->total_graphics.fetch_add(1, std::memory_order_relaxed);
								                 opts.control_block->cached_graphics.fetch_add(1, std::memory_order_relaxed);
							                 }
							                 else if (tag == RESOURCE_COMPUTE_PIPELINE)
							                 {
								                 opts.control_block->total_compute.fetch_add(1, std::memory_order_relaxed);
								                 opts.control_block->cached_compute.fetch_add(1, std::memory_order_relaxed);
							                 }
							                 else if (tag == RESOURCE_RAYTRACING_PIPELINE)
							                 {
								                 opts.control_block->total_raytracing.fetch_add(1, std::memory_order_relaxed);
								                 opts.control_block->cached_raytracing.fetch_add(1, std::memory_order_relaxed);
							                 }
						                 }
					                 }
					                 else
					                 {
						                 // We are going to free all existing parent pipelines, so we cannot reuse
						                 // any pipeline that was already compiled.
						                 PipelineWorkItem work_item;
						                 work_item.hash = hashes[index];
						                 work_item.tag = DerivedInfo::get_tag();
						                 work_item.parse_only = true;
						                 work_item.memory_context_index = memory_index;
						                 work_item.index = index - hash_offset;

						                 if (opts.control_block)
						                 {
							                 if (tag == RESOURCE_GRAPHICS_PIPELINE)
								                 opts.control_block->total_graphics.fetch_add(1, std::memory_order_relaxed);
							                 else if (tag == RESOURCE_COMPUTE_PIPELINE)
								                 opts.control_block->total_compute.fetch_add(1, std::memory_order_relaxed);
							                 else if (tag == RESOURCE_RAYTRACING_PIPELINE)
								                 opts.control_block->total_raytracing.fetch_add(1, std::memory_order_relaxed);
						                 }

						                 enqueue_work_item(work_item);
					                 }
				                 }
			                 }});

			if (memory_index == 0)
			{
				work.push_back({ get_order_index(MAINTAIN_LRU_CACHE),
				                 [this, &parents]() {
					                 // Now all worker threads are drained for any work which needs shader modules,
					                 // so we can maintain the shader module LRU cache while we're parsing new pipelines in parallel.
					                 shader_modules.prune_cache([this](Hash hash, VkShaderModule module) {
						                 assert(enqueued_shader_modules.count((VkShaderModule) hash) != 0);
						                 //LOGI("Removing shader module %016llx.\n", static_cast<unsigned long long>(hash));
						                 enqueued_shader_modules.erase((VkShaderModule) hash);
						                 if (module != VK_NULL_HANDLE)
						                 {
							                 device->get_feature_filter().unregister_shader_module_info(module);
							                 vkDestroyShaderModule(device->get_device(), module, nullptr);
						                 }

						                 shader_module_evicted_count.fetch_add(1, std::memory_order_relaxed);
					                 });

					                 // Need to forget that we have seen an object before so we can replay the same object multiple times.
					                 for (auto &per_thread : per_thread_data)
						                 if (per_thread.per_thread_replayers)
							                 per_thread.per_thread_replayers[SHADER_MODULE_MEMORY_CONTEXT].forget_handle_references();

									 // We also know that pipelines are not being compiled,
									 // so we can free pipelines.
									 // When using graphics pipeline libraries, most pipelines
									 // will be "parent" pipelines, which leads to excessive memory bloat
									 // if we keep them around indefinitely.
					                 free_pipelines();

					                 parents.clear();

					                 // We might have to replay the same pipeline multiple times,
					                 // forget handle references.
					                 for (auto &per_thread : per_thread_data)
						                 if (per_thread.per_thread_replayers)
							                 per_thread.per_thread_replayers[PARENT_PIPELINE_MEMORY_CONTEXT].forget_pipeline_handle_references();
				                 }});
			}

			work.push_back({ get_order_index(ENQUEUE_SHADER_MODULES_PRIMARY_OFFSET),
			                 [this, derived, deferred, memory_index]() {
				                 // Make sure all parsing of pipelines is complete for this memory context.
				                 sync_worker_memory_context(memory_index);

				                 // Enqueue creation of all shader modules which are referenced by the pipelines.
				                 for (auto &item : deferred[memory_index])
					                 if (item.info)
						                 enqueue_shader_modules(item.info);

				                 // There are two primary kinds of pipelines, derived and non-derived. We split compilation in two here.
				                 // Non-derived pipelines have no dependencies on other pipelines, so we can go ahead,
				                 // and we force that parent pipeline candidates cannot also be derived, which simplifies a lot of things.
				                 // While decompressing modules, we can sort the pipeline infos here in parallel.
				                 sort_deferred_derived_pipelines(*derived, deferred[memory_index]);
			                 }});

			work.push_back({ get_order_index(RESOLVE_SHADER_MODULE_AND_ENQUEUE_PIPELINES_PRIMARY_OFFSET),
			                 [this, derived, deferred, memory_index, hash_offset, start_index]() {
				                 // Make sure all VkShaderModules have been queued and completed.
				                 // We reserve a special memory context for all shader modules since other memory indices
				                 // might queue up shader module work which we need in our memory index.
				                 // Remap VkShaderModule references from hashes to real handles and enqueue
				                 // all non-derived pipelines for work.
				                 sync_worker_memory_context(SHADER_MODULE_MEMORY_CONTEXT);

				                 for (auto &item : deferred[memory_index])
				                 {
					                 if (item.info)
					                 {
						                 resolve_shader_modules(item.info);
						                 enqueue_pipeline(item.hash, item.info, item.pipeline,
						                                  item.index + hash_offset + start_index, memory_index);
					                 }
				                 }
			                 }});

			work.push_back({ get_order_index(ENQUEUE_OUT_OF_RANGE_PARENT_PIPELINES),
			                 [this, &pipelines, &parents, derived, parsed_parents]() {
				                 // Figure out which of the parent pipelines we need.
				                 for (auto &d : *derived)
					                 enqueue_parent_pipelines(d, pipelines, parents, *parsed_parents);
			                 }});

			if (memory_index == 0)
			{
				// This is a join-like operation. We need to wait for all parent pipelines and all shader modules to have completed.
				work.push_back({get_order_index(ENQUEUE_SHADER_MODULE_SECONDARY_OFFSET),
				                [this, &pipelines, &parents, parsed_parents, hash_offset, start_index]()
				                {
					                unordered_set<Hash> dependencies;
					                while (true)
					                {
						                // Wait until all parent pipelines have been parsed.
						                sync_worker_memory_context(PARENT_PIPELINE_MEMORY_CONTEXT);

						                dependencies.clear();
						                std::swap(*parsed_parents, dependencies);

						                for (auto dependency : dependencies)
						                {
							                // Handle nested libraries.
							                enqueue_parent_pipelines(parents.at(dependency), pipelines, parents, *parsed_parents);
						                }

						                if (parsed_parents->empty())
							                break;
					                }

					                // Queue up all shader modules if somehow the shader modules used by parent pipelines differ from children ...
					                for (auto &parent : parents)
					                {
						                // If we enqueued something here, we have to wait for shader handles to resolve.
						                if (parent.second.info)
							                enqueue_shader_modules(parent.second.info);
					                }

					                if (opts.control_block)
					                {
						                auto tag = DerivedInfo::get_tag();
						                if (tag == RESOURCE_GRAPHICS_PIPELINE)
						                {
							                opts.control_block->total_graphics.fetch_add(parents.size(),
							                                                             std::memory_order_relaxed);
						                }
						                else if (tag == RESOURCE_COMPUTE_PIPELINE)
						                {
							                opts.control_block->total_compute.fetch_add(parents.size(),
							                                                            std::memory_order_relaxed);
						                }
						                else if (tag == RESOURCE_RAYTRACING_PIPELINE)
						                {
							                opts.control_block->total_raytracing.fetch_add(parents.size(),
							                                                               std::memory_order_relaxed);
						                }
					                }

					                sync_worker_memory_context(SHADER_MODULE_MEMORY_CONTEXT);

					                unordered_map<Hash, uint32_t> parents_depth;

					                dependencies.clear();
					                for (const auto &parent : parents)
					                {
						                parents_depth[parent.first] = 0;

						                auto library = work_item_get_library_info(parent.second);
						                if (!library)
							                continue;

						                for (uint32_t i = 0; i < library->libraryCount; i++)
							                dependencies.insert((Hash)library->pLibraries[i]);
					                }

					                // Compute the depth of every pipeline library using a DFS starting at the top level libraries.
					                vector<DerivedInfo> ordered_parents; 
					                for (const auto &parent : parents)
					                {
						                ordered_parents.push_back(parent.second);

						                if (dependencies.count(parent.first) == 0)
							                compute_parents_depth(parents, parents_depth, parent.second, 0);
					                }

					                sort(begin(ordered_parents), end(ordered_parents), [&](const DerivedInfo &a, const DerivedInfo &b) -> bool {
						                return parents_depth.at(a.hash) > parents_depth.at(b.hash);
					                });

					                // We might be pulling in a parent pipeline from another memory context next iteration,
					                // so we need to wait for all normal memory contexts.
					                for (unsigned i = 0; i < NUM_PIPELINE_MEMORY_CONTEXTS; i++)
						                sync_worker_memory_context(i);

					                uint32_t prev_depth = UINT32_MAX;
					                for (auto &parent : ordered_parents)
					                {
						                if (!parent.info)
							                continue;

						                if (!derived_work_item_is_satisfied(parent, pipelines))
							                continue;

						                uint32_t depth = parents_depth.at(parent.hash);
						                if (prev_depth != depth)
						                {
							                prev_depth = depth;
							                sync_worker_memory_context(PARENT_PIPELINE_MEMORY_CONTEXT);
						                }

						                resolve_shader_modules(parent.info);
						                resolve_pipelines(parent, pipelines);
						                enqueue_pipeline(parent.hash, parent.info,
						                                 parent.pipeline,
						                                 parent.index + hash_offset + start_index,
						                                 PARENT_PIPELINE_MEMORY_CONTEXT);
					                }
				                }});
			}

			work.push_back({ get_order_index(ENQUEUE_DERIVED_PIPELINES_OFFSET),
			                 [this, &pipelines, derived, &parents, memory_index, hash_offset, start_index]() {
				                 // Go over all pipelines. If there are no further dependencies to resolve, we can go ahead and queue them up.
				                 // If an entry exists in pipelines, we have queued up that hash earlier, but it might not be done compiling yet.
				                 auto itr = unstable_remove_if(begin(*derived), end(*derived), [&](const DerivedInfo &info) -> bool {
					                 return derived_work_item_is_satisfied(info, pipelines) || parents.count(info.hash) != 0;
				                 });

				                 // Wait for parent pipelines to complete.
				                 // Only needed for first memory index.
				                 if (memory_index == 0)
				                 {
					                 sync_worker_memory_context(PARENT_PIPELINE_MEMORY_CONTEXT);

					                 // Now we have replayed the pipelines, so we can reclaim parent pipeline memory for this iteration.
					                 for (auto &per_thread : per_thread_data)
						                 if (per_thread.per_thread_replayers)
							                 per_thread.per_thread_replayers[PARENT_PIPELINE_MEMORY_CONTEXT].get_allocator().reset();
				                 }

				                 // Now we can enqueue pipeline compilation with correct pipeline handles.
				                 for (auto i = itr; i != end(*derived); ++i)
				                 {
					                 // itr always removes parent pipelines because they were already compiled
					                 // in ENQUEUE_SHADER_MODULE_SECONDARY_OFFSET. This way they do not count
					                 // as skipped, but it also means that we need to skip them here to avoid
					                 // compiling them twice.
					                 if (i->info && parents.count(i->hash) == 0)
					                 {
						                 resolve_shader_modules(i->info);
						                 resolve_pipelines(*i, pipelines);
						                 enqueue_pipeline(i->hash, i->info, i->pipeline,
						                                  i->index + hash_offset + start_index, memory_index);
					                 }
				                 }

				                 // It might be possible that we couldn't resolve some dependencies, log this.
				                 if (itr != begin(*derived))
				                 {
					                 auto skipped_count = unsigned(itr - begin(*derived));
					                 LOGW("%u pipelines were not compiled because parent pipelines do not exist.\n", skipped_count);

					                 if (opts.control_block)
					                 {
						                 auto tag = DerivedInfo::get_tag();
						                 if (tag == RESOURCE_GRAPHICS_PIPELINE)
							                 opts.control_block->skipped_graphics.fetch_add(skipped_count, std::memory_order_relaxed);
						                 else if (tag == RESOURCE_COMPUTE_PIPELINE)
							                 opts.control_block->skipped_compute.fetch_add(skipped_count, std::memory_order_relaxed);
						                 else if (tag == RESOURCE_RAYTRACING_PIPELINE)
							                 opts.control_block->skipped_raytracing.fetch_add(skipped_count, std::memory_order_relaxed);
					                 }
				                 }
			                 }});

			memory_index = (memory_index + 1) % NUM_PIPELINE_MEMORY_CONTEXTS;
		}

		// If the last work happens in memory context 0, we won't sync up memory context 1 properly.
		// Ensure that happens properly.
		work.push_back({ get_order_index(PARSE_ENQUEUE_OFFSET),
		                 [this, memory_index]() { sync_worker_memory_context(memory_index); }});
	}